

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O0

void __thiscall ON_DimStyle::SetMaskFrameType(ON_DimStyle *this,MaskFrame source)

{
  ON_TextMask *__src;
  undefined1 local_40 [8];
  ON_TextMask text_mask;
  MaskFrame source_local;
  ON_DimStyle *this_local;
  
  text_mask.m_content_hash.m_digest[0x13] = source;
  __src = TextMask(this);
  memcpy(local_40,__src,0x28);
  ON_TextMask::SetMaskFrameType((ON_TextMask *)local_40,text_mask.m_content_hash.m_digest[0x13]);
  Internal_SetTextMask(this,(ON_TextMask *)local_40);
  Internal_SetOverrideDimStyleCandidateFieldOverride(this,MaskFrameType);
  return;
}

Assistant:

void ON_DimStyle::SetMaskFrameType(ON_TextMask::MaskFrame source)
{
  // This function is for legacy compatibility.
  // In October 2016, text mask information was moved from
  // a collection of individual values on ON_DimStyle to
  // an ON_TextMask class and a single ON_TextMask m_text_mask member
  // on ON_DimStyle.
  ON_TextMask text_mask = TextMask();
  text_mask.SetMaskFrameType(source);
  Internal_SetTextMask(text_mask);
  Internal_SetOverrideDimStyleCandidateFieldOverride(ON_DimStyle::field::MaskFrameType);
}